

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,bool fHasEscape,
          bool fHasMultiChar,EncodedCharPtr pchMin,EncodedCharPtr p,EncodedCharPtr *pp)

{
  UTF8EncodingPolicyBase<false> *this_00;
  EncodedCharPtr last;
  size_t sVar1;
  LPCOLESTR prgch;
  Parser *this_01;
  Token *pTVar2;
  code *pcVar3;
  EncodedCharPtr puVar4;
  bool bVar5;
  byte bVar6;
  OLECHAR OVar7;
  BOOL BVar8;
  uint32 cch;
  tokens tVar9;
  undefined4 *puVar10;
  IdentPtr this_02;
  undefined7 in_register_00000011;
  uint uVar11;
  uint local_4c;
  uint local_48;
  codepoint_t local_44;
  int iStack_40;
  codepoint_t codePoint;
  EncodedCharPtr p_local;
  bool fHasMultiChar_local;
  
  local_48 = (uint)CONCAT71(in_register_00000011,fHasEscape);
  last = this->m_pchLast;
  _iStack_40 = p;
  p_local._7_1_ = fHasMultiChar;
  BVar8 = FastIdentifierContinue(this,(EncodedCharPtr *)&stack0xffffffffffffffc0,last);
  if (BVar8 == 0) {
    this_00 = &this->super_UTF8EncodingPolicyBase<false>;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      puVar4 = _iStack_40;
      local_44 = 0xffffffff;
      sVar1 = this_00->m_cMultiUnits;
      if (last <= _iStack_40) {
LAB_00f02542:
        this_00->m_cMultiUnits = sVar1;
        _iStack_40 = puVar4;
        break;
      }
      OVar7 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                        (this_00,(EncodedCharPtr *)&stack0xffffffffffffffc0,last);
      uVar11 = (uint)(ushort)OVar7;
      local_4c = (uint)(ushort)OVar7;
      if (local_4c < 0x80) {
        if (uVar11 == 0x5c) {
          bVar5 = TryReadEscape(this,(EncodedCharPtr *)&stack0xffffffffffffffc0,last,&local_4c);
          local_48 = local_48 & 0xff;
          if (bVar5) {
            local_48 = 1;
          }
        }
LAB_00f024ba:
        local_44 = local_4c;
      }
      else {
        p_local._7_1_ = 1;
        if ((this->es6UnicodeMode != true) ||
           (bVar5 = Js::NumberUtilities::IsSurrogateLowerPart(uVar11), !bVar5)) goto LAB_00f024ba;
        bVar5 = TryReadCodePointRest<true>
                          (this,uVar11,(EncodedCharPtr *)&stack0xffffffffffffffc0,last,&local_44,
                           (bool *)((long)&p_local + 7));
        if (!bVar5) goto LAB_00f02542;
      }
      if (0x10ffff < local_44) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x1e3,"(codePoint < 0x110000u)","codePoint < 0x110000u");
        if (!bVar5) goto LAB_00f028ab;
        *puVar10 = 0;
      }
      bVar5 = Js::CharClassifier::IsIdContinue(this->charClassifier,local_44);
      if (!bVar5) goto LAB_00f02542;
      BVar8 = FastIdentifierContinue(this,(EncodedCharPtr *)&stack0xffffffffffffffc0,last);
    } while (BVar8 == 0);
  }
  uVar11 = local_48;
  bVar6 = (byte)local_48;
  this->field_0x508 = (this->field_0x508 & 0xef) + bVar6 * '\x10';
  if ((ulong)((long)pchMin - (long)_iStack_40) < 0xffffffff80000001) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x1f2,"(p - pchMin > 0 && p - pchMin <= 2147483647L)",
                       "p - pchMin > 0 && p - pchMin <= LONG_MAX");
    if (!bVar5) goto LAB_00f028ab;
    *puVar10 = 0;
  }
  *pp = _iStack_40;
  if (!identifyKwds) {
    return tkID;
  }
  if (((bool)p_local._7_1_ == false) && ((uVar11 & 1) == 0)) {
    cch = UnescapeToTempBuf(this,pchMin,_iStack_40);
    prgch = (this->m_tempChBuf).m_prgch;
    if (this->m_parser == (Parser *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::TkFromNameLen(prgch,cch,bVar5);
    if (tVar9 == tkAWAIT) {
      if ((this->m_fAwaitIsKeywordRegion == false) && ((this->field_0x508 & 1) == 0))
      goto LAB_00f02724;
    }
    else if ((tVar9 == tkID) ||
            (((tVar9 == tkYIELD && (this->m_fYieldIsKeywordRegion == false)) &&
             ((this->m_parser == (Parser *)0x0 ||
              (bVar5 = Parser::IsStrictMode(this->m_parser), !bVar5)))))) goto LAB_00f02724;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x204,
                       "(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar5) {
      *puVar10 = 0;
LAB_00f02724:
      pTVar2 = this->m_ptoken;
      (pTVar2->u).field_0.pid = (IdentPtr)0x0;
      (pTVar2->u).field_0.pchMin = (char *)pchMin;
      (pTVar2->u).field_0.length = iStack_40 - (int)pchMin;
      return tkID;
    }
  }
  else {
    bVar6 = p_local._7_1_ ^ 1 | bVar6;
    this_02 = PidOfIdentiferAt(this,pchMin,_iStack_40,(bool)(bVar6 & 1),(bool)p_local._7_1_);
    pTVar2 = this->m_ptoken;
    (pTVar2->u).field_0.pid = this_02;
    (pTVar2->u).field_0.pchMin = (char *)0x0;
    this_01 = this->m_parser;
    if ((bVar6 & 1) != 0) {
      if (this_01 == (Parser *)0x0) {
        bVar5 = false;
      }
      else {
        bVar5 = Parser::IsStrictMode(this_01);
      }
      tVar9 = Ident::Tk(this_02,bVar5);
      if (tVar9 == tkAWAIT) {
        tVar9 = tkID;
        if ((this->field_0x508 & 1) != 0) {
          tVar9 = tkNone;
        }
        if (this->m_fAwaitIsKeywordRegion == false) {
          return tVar9;
        }
        return tkNone;
      }
      if (tVar9 == tkID) {
        return tkID;
      }
      if ((tVar9 == tkYIELD) && (this->m_fYieldIsKeywordRegion == false)) {
        if (this->m_parser == (Parser *)0x0) {
          return tkID;
        }
        bVar5 = Parser::IsStrictMode(this->m_parser);
        if (!bVar5) {
          return tkID;
        }
      }
      return tkNone;
    }
    if (this_01 == (Parser *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = Parser::IsStrictMode(this_01);
    }
    tVar9 = Ident::Tk(this_02,bVar5);
    if (tVar9 == tkID) {
      return tkID;
    }
    if (this->m_parser == (Parser *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::Tk(this_02,bVar5);
    if ((tVar9 == tkYIELD) && (this->m_fYieldIsKeywordRegion == false)) {
      if (this->m_parser == (Parser *)0x0) {
        return tkID;
      }
      bVar5 = Parser::IsStrictMode(this->m_parser);
      if (!bVar5) {
        return tkID;
      }
    }
    if (this->m_parser == (Parser *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::Tk(this_02,bVar5);
    if (((tVar9 == tkAWAIT) && (this->m_fAwaitIsKeywordRegion == false)) &&
       ((this->field_0x508 & 1) == 0)) {
      return tkID;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x215,
                       "(pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar5) {
      *puVar10 = 0;
      return tkID;
    }
  }
LAB_00f028ab:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifierContinue(bool identifyKwds, bool fHasEscape, bool fHasMultiChar,
    EncodedCharPtr pchMin, EncodedCharPtr p, EncodedCharPtr *pp)
{
    EncodedCharPtr last = m_pchLast;

    while (true)
    {
        // Fast path for utf8, non-multi unit char and not escape
        if (FastIdentifierContinue(p, last))
        {
            break;
        }

        // Slow path that has to deal with multi unit encoding
        codepoint_t codePoint = INVALID_CODEPOINT;
        EncodedCharPtr pchBeforeLast = p;
        size_t multiUnitsBeforeLast = this->m_cMultiUnits;
        if (TryReadCodePoint<true>(p, last, &codePoint, &fHasEscape, &fHasMultiChar))
        {
            Assert(codePoint < 0x110000u);
            if (charClassifier->IsIdContinue(codePoint))
            {
                continue;
            }
        }

        // Put back the last character
        p = pchBeforeLast;
        this->RestoreMultiUnits(multiUnitsBeforeLast);
        break;
    }

    m_lastIdentifierHasEscape = fHasEscape;

    Assert(p - pchMin > 0 && p - pchMin <= LONG_MAX);

    *pp = p;

    if (!identifyKwds)
    {
        return tkID;
    }

    // UTF16 Scanner are only for syntax coloring, so it shouldn't come here.
    if (EncodingPolicy::MultiUnitEncoding && !fHasMultiChar && !fHasEscape)
    {
        Assert(sizeof(EncodedChar) == 1);

        // If there are no escape, that the main scan loop would have found the keyword already
        // So we can just assume it is an ID
        DebugOnly(int32 cch = UnescapeToTempBuf(pchMin, p));
        DebugOnly(tokens tk = Ident::TkFromNameLen(m_tempChBuf.m_prgch, cch, IsStrictMode()));
        Assert(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()));

        m_ptoken->SetIdentifier(reinterpret_cast<const char *>(pchMin), (int32)(p - pchMin));
        return tkID;
    }

    IdentPtr pid = PidOfIdentiferAt(pchMin, p, fHasEscape, fHasMultiChar);
    m_ptoken->SetIdentifier(pid);

    if (!fHasEscape)
    {
        // If it doesn't have escape, then Scan() should have taken care of keywords (except
        // yield if m_fYieldIsKeyword is false, in which case yield is treated as an identifier, and except
        // await if m_fAwaitIsKeyword is false, in which case await is treated as an identifier).
        // We don't have to check if the name is reserved word and return it as an Identifier
        Assert(pid->Tk(IsStrictMode()) == tkID
            || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword())
            || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()));
        return tkID;
    }
    tokens tk = pid->Tk(IsStrictMode());
    return tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()) ? tkID : tkNone;
}